

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chartype.c
# Opt level: O0

char * ct_encode_string(wchar_t *s,ct_buffer_t *conv)

{
  wchar_t wVar1;
  long lVar2;
  ssize_t sVar3;
  ssize_t used;
  char *dst;
  ct_buffer_t *conv_local;
  wchar_t *s_local;
  
  if (s == (wchar_t *)0x0) {
    return (char *)0x0;
  }
  used = (ssize_t)conv->cbuff;
  conv_local = (ct_buffer_t *)s;
  while( true ) {
    lVar2 = used - (long)conv->cbuff;
    if (conv->csize - lVar2 < 5) {
      wVar1 = ct_conv_cbuff_resize(conv,conv->csize + 0x400);
      if (wVar1 == L'\xffffffff') {
        return (char *)0x0;
      }
      used = (ssize_t)(conv->cbuff + lVar2);
    }
    if (*(int *)&conv_local->cbuff == 0) break;
    sVar3 = ct_encode_char((char *)used,5,*(wchar_t *)&conv_local->cbuff);
    if (sVar3 == -1) {
      abort();
    }
    conv_local = (ct_buffer_t *)((long)&conv_local->cbuff + 4);
    used = sVar3 + used;
  }
  *(undefined1 *)used = 0;
  return conv->cbuff;
}

Assistant:

char *
ct_encode_string(const wchar_t *s, ct_buffer_t *conv)
{
	char *dst;
	ssize_t used;

	if (!s)
		return NULL;

	dst = conv->cbuff;
	for (;;) {
		used = (ssize_t)(dst - conv->cbuff);
		if ((conv->csize - (size_t)used) < 5) {
			if (ct_conv_cbuff_resize(conv,
			    conv->csize + CT_BUFSIZ) == -1)
				return NULL;
			dst = conv->cbuff + used;
		}
		if (!*s)
			break;
		used = ct_encode_char(dst, (size_t)5, *s);
		if (used == -1) /* failed to encode, need more buffer space */
			abort();
		++s;
		dst += used;
	}
	*dst = '\0';
	return conv->cbuff;
}